

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void update_width(ProgressData *bar)

{
  uint uVar1;
  int cols;
  ProgressData *bar_local;
  
  uVar1 = get_terminal_columns();
  if ((int)uVar1 < 0x191) {
    if ((int)uVar1 < 0x15) {
      bar->width = 0x14;
    }
    else {
      bar->width = uVar1;
    }
  }
  else {
    bar->width = 400;
  }
  return;
}

Assistant:

static void update_width(struct ProgressData *bar)
{
  int cols = get_terminal_columns();
  if(cols > MAX_BARLENGTH)
    bar->width = MAX_BARLENGTH;
  else if(cols > MIN_BARLENGTH)
    bar->width = (int)cols;
  else
    bar->width = MIN_BARLENGTH;
}